

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O0

void Abc_ManShowCutCone_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vDivs)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vDivs_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    pAVar2 = Abc_ObjFanin0(pNode);
    Abc_ManShowCutCone_rec(pAVar2,vDivs);
    pAVar2 = Abc_ObjFanin1(pNode);
    Abc_ManShowCutCone_rec(pAVar2,vDivs);
    Vec_PtrPush(vDivs,pNode);
  }
  return;
}

Assistant:

void Abc_ManShowCutCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vDivs )
{
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    Abc_ManShowCutCone_rec( Abc_ObjFanin0(pNode), vDivs );
    Abc_ManShowCutCone_rec( Abc_ObjFanin1(pNode), vDivs );
    Vec_PtrPush( vDivs, pNode );
}